

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

kvtree * kvtree_extract(kvtree *hash,char *key)

{
  kvtree_struct *pkVar1;
  kvtree_elem *pkVar2;
  kvtree_elem *unaff_RBX;
  
  if ((hash != (kvtree *)0x0) &&
     (pkVar2 = kvtree_elem_extract(hash,key), pkVar2 != (kvtree_elem *)0x0)) {
    pkVar1 = pkVar2->hash;
    pkVar2->hash = (kvtree_struct *)0x0;
    kvtree_elem_delete(unaff_RBX);
    return pkVar1;
  }
  return (kvtree *)0x0;
}

Assistant:

kvtree* kvtree_extract(kvtree* hash, const char* key)
{
  if (hash == NULL) {
    return NULL;
  }

  kvtree_elem* elem = kvtree_elem_extract(hash, key);
  if (elem != NULL) {
    kvtree* elem_hash = elem->hash;
    elem->hash = NULL;
    kvtree_elem_delete(elem);
    return elem_hash;
  }
  return NULL;
}